

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

void * vsnapshot_tilde_new(void)

{
  t_object *owner;
  
  owner = (t_object *)pd_new(vsnapshot_tilde_class);
  outlet_new(owner,&s_float);
  owner[1].te_g.g_pd = (t_pd)0x0;
  owner[1].te_g.g_next = (_gobj *)0x0;
  *(undefined4 *)&owner[1].te_binbuf = 0;
  return owner;
}

Assistant:

static void *vsnapshot_tilde_new(void)
{
    t_vsnapshot *x = (t_vsnapshot *)pd_new(vsnapshot_tilde_class);
    outlet_new(&x->x_obj, &s_float);
    x->x_f = 0;
    x->x_n = 0;
    x->x_vec = 0;
    x->x_gotone = 0;
    return (x);
}